

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

_Bool sx_hashtbl_grow(sx_hashtbl **ptbl,sx_alloc *alloc)

{
  int iVar1;
  sx_hashtbl *tbl_00;
  sx_hashtbl *tbl_01;
  int local_34;
  int c;
  int i;
  sx_hashtbl *new_tbl;
  sx_hashtbl *tbl;
  sx_alloc *alloc_local;
  sx_hashtbl **ptbl_local;
  
  tbl_00 = *ptbl;
  tbl_01 = sx_hashtbl_create(alloc,tbl_00->capacity << 1);
  if (tbl_01 == (sx_hashtbl *)0x0) {
    ptbl_local._7_1_ = false;
  }
  else {
    local_34 = 0;
    iVar1 = tbl_00->capacity;
    for (; local_34 < iVar1; local_34 = local_34 + 1) {
      if (tbl_00->keys[local_34] != 0) {
        sx_hashtbl_add(tbl_01,tbl_00->keys[local_34],tbl_00->values[local_34]);
      }
    }
    sx_hashtbl_destroy(tbl_00,alloc);
    *ptbl = tbl_01;
    ptbl_local._7_1_ = true;
  }
  return ptbl_local._7_1_;
}

Assistant:

bool sx_hashtbl_grow(sx_hashtbl** ptbl, const sx_alloc* alloc)
{
    sx_hashtbl* tbl = *ptbl;
    // Create a new table (double the size), repopulate it and replace previous one
    sx_hashtbl* new_tbl = sx_hashtbl_create(alloc, tbl->capacity << 1);
    if (!new_tbl)
        return false;

    for (int i = 0, c = tbl->capacity; i < c; i++) {
        if (tbl->keys[i] > 0)
            sx_hashtbl_add(new_tbl, tbl->keys[i], tbl->values[i]);
    }

    sx_hashtbl_destroy(tbl, alloc);
    *ptbl = new_tbl;
    return true;
}